

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

Metric * __thiscall xLearn::Solver::create_metric(Solver *this)

{
  Metric *pMVar1;
  allocator local_29;
  string local_28;
  
  if (GetRegistry_xLearn_metric_registry()::registry == '\0') {
    create_metric();
  }
  std::__cxx11::string::string
            ((string *)&local_28,(this->hyper_param_).metric._M_dataplus._M_p,&local_29);
  pMVar1 = ObjectCreatorRegistry_xLearn_metric_registry::CreateObject
                     ((ObjectCreatorRegistry_xLearn_metric_registry *)
                      &GetRegistry_xLearn_metric_registry()::registry,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return pMVar1;
}

Assistant:

Metric* Solver::create_metric() {
  Metric* metric;
  metric = CREATE_METRIC(hyper_param_.metric.c_str());
  // Note that here we do not cheack metric == nullptr
  // this is because we can set metric to "none", which 
  // means that we don't print any metric info.
  return metric;
}